

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O0

UBool anon_unknown.dwarf_38436b::characterproperties_cleanup(void)

{
  UnicodeSet *pUVar1;
  void *in_RSI;
  int local_30;
  int local_2c;
  int32_t i_1;
  int32_t i;
  Inclusion *in;
  Inclusion *__end1;
  Inclusion *__begin1;
  Inclusion (*__range1) [15];
  
  for (__end1 = (Inclusion *)&(anonymous_namespace)::gInclusions;
      __end1 != (Inclusion *)(anonymous_namespace)::cpMutex; __end1 = __end1 + 1) {
    pUVar1 = __end1->fSet;
    if (pUVar1 != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::~UnicodeSet(pUVar1);
      icu_63::UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
    }
    __end1->fSet = (UnicodeSet *)0x0;
    icu_63::UInitOnce::reset(&__end1->fInitOnce);
  }
  for (local_2c = 0; local_2c < 0x41; local_2c = local_2c + 1) {
    pUVar1 = *(UnicodeSet **)((anonymous_namespace)::sets + (long)local_2c * 8);
    if (pUVar1 != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::~UnicodeSet(pUVar1);
      icu_63::UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
    }
    *(undefined8 *)((anonymous_namespace)::sets + (long)local_2c * 8) = 0;
  }
  for (local_30 = 0; local_30 < 0x19; local_30 = local_30 + 1) {
    ucptrie_close_63(*(UCPTrie **)((anonymous_namespace)::maps + (long)local_30 * 8));
    *(undefined8 *)((anonymous_namespace)::maps + (long)local_30 * 8) = 0;
  }
  return '\x01';
}

Assistant:

UBool U_CALLCONV characterproperties_cleanup() {
    for (Inclusion &in: gInclusions) {
        delete in.fSet;
        in.fSet = nullptr;
        in.fInitOnce.reset();
    }
    for (int32_t i = 0; i < UPRV_LENGTHOF(sets); ++i) {
        delete sets[i];
        sets[i] = nullptr;
    }
    for (int32_t i = 0; i < UPRV_LENGTHOF(maps); ++i) {
        ucptrie_close(reinterpret_cast<UCPTrie *>(maps[i]));
        maps[i] = nullptr;
    }
    return TRUE;
}